

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprand.h
# Opt level: O2

int * rprand_load_sequence(uint count,int min,int max)

{
  int *piVar1;
  uint32_t uVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  uint i;
  uint uVar6;
  int iVar7;
  
  iVar5 = max - min;
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
  uVar6 = 0;
  if (iVar7 + 1U < count) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)calloc((ulong)count,4);
LAB_0015a931:
    if (uVar6 < count) {
      uVar2 = rprand_xoshiro();
      iVar5 = uVar2 % (iVar7 + 1U) + min;
      uVar4 = 0;
      do {
        if (uVar6 == uVar4) {
          piVar3[uVar6] = iVar5;
          uVar6 = uVar6 + 1;
          break;
        }
        piVar1 = piVar3 + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 != iVar5);
      goto LAB_0015a931;
    }
  }
  return piVar3;
}

Assistant:

int *rprand_load_sequence(unsigned int count, int min, int max)
{
    int *sequence = NULL;
    
    if (count > (unsigned int)(abs(max - min) + 1)) 
    {
        RPRAND_LOG("WARNING: Sequence count required is greater than range provided\n");
        //count = (max - min);
        return sequence;
    }

    sequence = (int *)RPRAND_CALLOC(count, sizeof(int));

    int value = 0;
    bool value_is_dup = false;

    for (unsigned int i = 0; i < count;)
    {
        value = ((unsigned int)rprand_xoshiro()%(abs(max - min) + 1)) + min;

        for (unsigned int j = 0; j < i; j++)
        {
            if (sequence[j] == value)
            {
                value_is_dup = true;
                break;
            }
        }

        if (!value_is_dup)
        {
            sequence[i] = value;
            i++;
        }

        value_is_dup = false;
    }

    return sequence;
}